

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O2

int mbedtls_hmac_drbg_update_ret(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t add_len)

{
  uchar *input;
  byte bVar1;
  int iVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  ulong ilen;
  byte local_95;
  int local_94;
  uchar *local_90;
  size_t local_88;
  undefined8 local_80;
  uchar K [64];
  
  bVar1 = mbedtls_md_get_size((ctx->md_ctx).md_info);
  ilen = (ulong)bVar1;
  bVar3 = add_len != 0 && additional != (uchar *)0x0;
  input = ctx->V;
  local_80 = CONCAT71(in_register_00000009,bVar3);
  local_94 = (int)CONCAT71(in_register_00000009,bVar3) + 1;
  iVar2 = -0x5100;
  local_95 = 0;
  local_90 = additional;
  local_88 = add_len;
  while (((((local_95 < (byte)local_94 && (iVar2 = mbedtls_md_hmac_reset(&ctx->md_ctx), iVar2 == 0))
           && (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 == 0)) &&
          (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,&local_95,1), iVar2 == 0)) &&
         (((((char)local_80 == '\0' ||
            (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,local_90,local_88), iVar2 == 0)) &&
           ((iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,K), iVar2 == 0 &&
            ((iVar2 = mbedtls_md_hmac_starts(&ctx->md_ctx,K,ilen), iVar2 == 0 &&
             (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 == 0)))))) &&
          (iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,input), iVar2 == 0))))) {
    local_95 = local_95 + 1;
    iVar2 = 0;
  }
  mbedtls_platform_zeroize(K,0x40);
  return iVar2;
}

Assistant:

int mbedtls_hmac_drbg_update_ret( mbedtls_hmac_drbg_context *ctx,
                                  const unsigned char *additional,
                                  size_t add_len )
{
    size_t md_len = mbedtls_md_get_size( ctx->md_ctx.md_info );
    unsigned char rounds = ( additional != NULL && add_len != 0 ) ? 2 : 1;
    unsigned char sep[1];
    unsigned char K[MBEDTLS_MD_MAX_SIZE];
    int ret = MBEDTLS_ERR_MD_BAD_INPUT_DATA;

    for( sep[0] = 0; sep[0] < rounds; sep[0]++ )
    {
        /* Step 1 or 4 */
        if( ( ret = mbedtls_md_hmac_reset( &ctx->md_ctx ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            ctx->V, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            sep, 1 ) ) != 0 )
            goto exit;
        if( rounds == 2 )
        {
            if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                                additional, add_len ) ) != 0 )
            goto exit;
        }
        if( ( ret = mbedtls_md_hmac_finish( &ctx->md_ctx, K ) ) != 0 )
            goto exit;

        /* Step 2 or 5 */
        if( ( ret = mbedtls_md_hmac_starts( &ctx->md_ctx, K, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            ctx->V, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_finish( &ctx->md_ctx, ctx->V ) ) != 0 )
            goto exit;
    }

exit:
    mbedtls_platform_zeroize( K, sizeof( K ) );
    return( ret );
}